

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

bool __thiscall CGraphics_Threaded::SetVSync(CGraphics_Threaded *this,bool State)

{
  byte in_SIL;
  CCommandBuffer *in_RDI;
  long in_FS_OFFSET;
  CVSyncCommand Cmd;
  bool RetOk;
  CGraphics_Threaded *this_00;
  undefined1 local_30 [39];
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  this_00 = (CGraphics_Threaded *)local_30;
  CCommandBuffer::CVSyncCommand::CVSyncCommand((CVSyncCommand *)0x131812);
  local_30._16_4_ = ZEXT14(in_SIL & 1);
  local_30._24_8_ = &local_9;
  CCommandBuffer::AddCommand<CCommandBuffer::CVSyncCommand>(in_RDI,(CVSyncCommand *)this_00);
  KickCommandBuffer(this_00);
  (**(code **)((in_RDI->m_CmdBuffer).m_pData + 0x150))();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CGraphics_Threaded::SetVSync(bool State)
{
	// add vsnc command
	bool RetOk = 0;
	CCommandBuffer::CVSyncCommand Cmd;
	Cmd.m_VSync = State ? 1 : 0;
	Cmd.m_pRetOk = &RetOk;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the command buffer
	KickCommandBuffer();
	WaitForIdle();
	return RetOk;
}